

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oauth2.c
# Opt level: O2

CURLcode Curl_auth_create_xoauth_bearer_message(char *user,char *bearer,bufref *out)

{
  char *__s;
  size_t len;
  CURLcode CVar1;
  
  CVar1 = CURLE_OK;
  __s = curl_maprintf("user=%s\x01auth=Bearer %s\x01\x01",user,bearer);
  if (__s == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = strlen(__s);
    Curl_bufref_set(out,__s,len,curl_free);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_auth_create_xoauth_bearer_message(const char *user,
                                               const char *bearer,
                                               struct bufref *out)
{
  /* Generate the message */
  char *xoauth = aprintf("user=%s\1auth=Bearer %s\1\1", user, bearer);
  if(!xoauth)
    return CURLE_OUT_OF_MEMORY;

  Curl_bufref_set(out, xoauth, strlen(xoauth), curl_free);
  return CURLE_OK;
}